

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O1

void __thiscall PressDelayHandler::~PressDelayHandler(PressDelayHandler *this)

{
  Data *pDVar1;
  QMouseEvent *pQVar2;
  
  *(undefined ***)this = &PTR_metaObject_00823970;
  pDVar1 = (this->mouseTarget).wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if ((*(int *)pDVar1 == 0) && (pDVar1 = (this->mouseTarget).wp.d, pDVar1 != (Data *)0x0)) {
      operator_delete(pDVar1);
    }
  }
  pQVar2 = (this->pressDelayEvent).d;
  if (pQVar2 != (QMouseEvent *)0x0) {
    (**(code **)(*(long *)pQVar2 + 8))();
  }
  if ((this->pressDelayTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x40);
  return;
}

Assistant:

PressDelayHandler(QObject *parent = nullptr)
        : QObject(parent)
        , sendingEvent(false)
        , mouseButton(Qt::NoButton)
        , mouseTarget(nullptr)
        , mouseEventSource(Qt::MouseEventNotSynthesized)
    { }